

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode parse_numericrange(UA_String *str,UA_NumericRange *range)

{
  UA_NumericRangeDimension *pUVar1;
  size_t sVar2;
  UA_StatusCode UVar3;
  ulong uVar4;
  long lVar5;
  UA_Byte *buf;
  ulong uVar6;
  UA_NumericRangeDimension *__ptr;
  ulong uVar7;
  long local_48;
  ulong local_40;
  
  local_48 = 4;
  lVar5 = 0;
  __ptr = (UA_NumericRangeDimension *)0x0;
  local_40 = 0;
  uVar4 = 0;
  do {
    if (local_40 <= uVar4) {
      pUVar1 = (UA_NumericRangeDimension *)realloc(__ptr,local_40 * 8 + 0x10);
      if (pUVar1 == (UA_NumericRangeDimension *)0x0) {
        UVar3 = 0x80030000;
        break;
      }
      local_40 = local_40 + 2;
      __ptr = pUVar1;
    }
    buf = str->data + lVar5;
    uVar6 = str->length - lVar5;
    sVar2 = UA_readNumber(buf,uVar6,(UA_UInt32 *)((long)__ptr + local_48 + -4));
    UVar3 = 0x80360000;
    if (sVar2 == 0) break;
    uVar7 = sVar2 + 1;
    if ((uVar6 < uVar7 || uVar6 - uVar7 == 0) || (buf[sVar2] != ':')) {
      __ptr[uVar4].max = __ptr[uVar4].min;
    }
    else {
      sVar2 = UA_readNumber(buf + uVar7,uVar6 - uVar7,(UA_UInt32 *)((long)&__ptr->min + local_48));
      if (sVar2 == 0) {
        UVar3 = 0x80360000;
        break;
      }
      sVar2 = sVar2 + uVar7;
      UVar3 = 0x80360000;
      if ((sVar2 == 0) || (__ptr[uVar4].max <= __ptr[uVar4].min)) break;
    }
    UVar3 = 0x80360000;
    uVar6 = sVar2 + lVar5;
    if (str->length <= uVar6) {
      UVar3 = 0;
      if (uVar4 + 1 != 0) {
        range->dimensions = __ptr;
        range->dimensionsSize = uVar4 + 1;
        return 0;
      }
      break;
    }
    lVar5 = uVar6 + 1;
    local_48 = local_48 + 8;
    uVar4 = uVar4 + 1;
  } while (str->data[uVar6] == ',');
  free(__ptr);
  return UVar3;
}

Assistant:

UA_StatusCode
parse_numericrange(const UA_String *str, UA_NumericRange *range) {
    size_t idx = 0;
    size_t dimensionsMax = 0;
    UA_NumericRangeDimension *dimensions = NULL;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    size_t offset = 0;
    while(true) {
        /* alloc dimensions */
        if(idx >= dimensionsMax) {
            UA_NumericRangeDimension *newds;
            size_t newdssize = sizeof(UA_NumericRangeDimension) * (dimensionsMax + 2);
            newds = UA_realloc(dimensions, newdssize);
            if(!newds) {
                retval = UA_STATUSCODE_BADOUTOFMEMORY;
                break;
            }
            dimensions = newds;
            dimensionsMax = dimensionsMax + 2;
        }

        /* read the dimension */
        size_t progress = readDimension(&str->data[offset], str->length - offset,
                                        &dimensions[idx]);
        if(progress == 0) {
            retval = UA_STATUSCODE_BADINDEXRANGEINVALID;
            break;
        }
        offset += progress;
        ++idx;

        /* loop into the next dimension */
        if(offset >= str->length)
            break;

        if(str->data[offset] != ',') {
            retval = UA_STATUSCODE_BADINDEXRANGEINVALID;
            break;
        }
        ++offset;
    }

    if(retval == UA_STATUSCODE_GOOD && idx > 0) {
        range->dimensions = dimensions;
        range->dimensionsSize = idx;
    } else
        UA_free(dimensions);

    return retval;
}